

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::UpdateMetadata
          (MemoryOutputStream *this,size_t insertion_offset,size_t insertion_length)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int32 iVar4;
  ostream *poVar5;
  GeneratedCodeInfo_Annotation *this_00;
  ulong in_RSI;
  long in_RDI;
  Annotation *annotation;
  int i;
  bool is_text_format;
  GeneratedCodeInfo metadata;
  string *encoded_data;
  iterator it;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  GeneratedCodeInfo_Annotation *in_stack_fffffffffffffee0;
  GeneratedCodeInfo *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int iVar6;
  undefined4 in_stack_ffffffffffffff0c;
  Message *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  int local_9c;
  string *in_stack_ffffffffffffff78;
  Message *in_stack_ffffffffffffff80;
  _Self local_58 [3];
  string local_40 [32];
  _Self local_20 [2];
  ulong local_10;
  
  local_10 = in_RSI;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (char *)in_stack_ffffffffffffff00);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(key_type *)0x4106b5)
  ;
  std::__cxx11::string::~string(local_40);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  bVar1 = std::operator==(local_20,local_58);
  if (bVar1) {
    return;
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x410743);
  GeneratedCodeInfo::GeneratedCodeInfo(in_stack_ffffffffffffff00);
  bVar1 = false;
  bVar2 = MessageLite::ParseFromString
                    ((MessageLite *)in_stack_fffffffffffffee0,
                     (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (!bVar2) {
    bVar1 = TextFormat::ParseFromString
                      ((string *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff18);
    if (!bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 0x10));
      poVar5 = std::operator<<(poVar5,".meta: Could not parse metadata as wire or text format.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      goto LAB_00410980;
    }
    bVar1 = true;
  }
  local_9c = 0;
  while (iVar6 = local_9c, iVar3 = GeneratedCodeInfo::annotation_size((GeneratedCodeInfo *)0x41085c)
        , iVar6 < iVar3) {
    this_00 = GeneratedCodeInfo::mutable_annotation
                        ((GeneratedCodeInfo *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    iVar4 = GeneratedCodeInfo_Annotation::begin((GeneratedCodeInfo_Annotation *)0x4108a7);
    if (local_10 <= (ulong)(long)iVar4) {
      GeneratedCodeInfo_Annotation::begin((GeneratedCodeInfo_Annotation *)0x4108cf);
      GeneratedCodeInfo_Annotation::set_begin(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      GeneratedCodeInfo_Annotation::end((GeneratedCodeInfo_Annotation *)0x410900);
      GeneratedCodeInfo_Annotation::set_end(this_00,in_stack_fffffffffffffedc);
      in_stack_fffffffffffffee0 = this_00;
    }
    local_9c = local_9c + 1;
  }
  if (bVar1) {
    TextFormat::PrintToString(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    MessageLite::SerializeToString
              ((MessageLite *)in_stack_fffffffffffffee0,
               (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
LAB_00410980:
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)in_stack_fffffffffffffee0);
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::UpdateMetadata(
    size_t insertion_offset, size_t insertion_length) {
  auto it = directory_->files_.find(filename_ + ".meta");
  if (it == directory_->files_.end()) {
    // No metadata was recorded for this file.
    return;
  }
  std::string& encoded_data = it->second;
  GeneratedCodeInfo metadata;
  bool is_text_format = false;
  if (!metadata.ParseFromString(encoded_data)) {
    if (!TextFormat::ParseFromString(encoded_data, &metadata)) {
      // The metadata is invalid.
      std::cerr << filename_
                << ".meta: Could not parse metadata as wire or text format."
                << std::endl;
      return;
    }
    // Generators that use the public plugin interface emit text-format
    // metadata (because in the public plugin protocol, file content must be
    // UTF8-encoded strings).
    is_text_format = true;
  }
  for (int i = 0; i < metadata.annotation_size(); ++i) {
    GeneratedCodeInfo::Annotation* annotation = metadata.mutable_annotation(i);
    if (annotation->begin() >= insertion_offset) {
      annotation->set_begin(annotation->begin() + insertion_length);
      annotation->set_end(annotation->end() + insertion_length);
    }
  }
  if (is_text_format) {
    TextFormat::PrintToString(metadata, &encoded_data);
  } else {
    metadata.SerializeToString(&encoded_data);
  }
}